

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void testing::internal::TuplePrefix<1ul>::
     ExplainMatchFailuresTo<std::tuple<testing::Matcher<cv::Mat>>,std::tuple<cv::Mat>>
               (tuple<testing::Matcher<cv::Mat>_> *matchers,tuple<cv::Mat> *values,ostream *os)

{
  MatcherInterface<cv::Mat> *pMVar1;
  bool bVar2;
  ostream *poVar3;
  undefined1 local_2b0 [8];
  StringMatchResultListener listener;
  Mat local_b8 [8];
  Value value;
  string local_58;
  undefined1 local_38 [8];
  type matcher;
  
  Matcher<cv::Mat>::Matcher((Matcher<cv::Mat> *)local_38,(Matcher<cv::Mat> *)matchers);
  cv::Mat::Mat(local_b8,(Mat *)values);
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_2b0);
  cv::Mat::Mat((Mat *)&listener.field_0x190,local_b8);
  bVar2 = MatcherBase<cv::Mat>::MatchAndExplain
                    ((MatcherBase<cv::Mat> *)local_38,(Mat *)&listener.field_0x190,
                     (MatchResultListener *)local_2b0);
  cv::Mat::~Mat((Mat *)&listener.field_0x190);
  if (!bVar2) {
    poVar3 = std::operator<<(os,"  Expected arg #");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3,": ");
    pMVar1 = (matchers->super__Tuple_impl<0UL,_testing::Matcher<cv::Mat>_>).
             super__Head_base<0UL,_testing::Matcher<cv::Mat>,_false>._M_head_impl.
             super_MatcherBase<cv::Mat>.impl_.value_;
    (*(pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface[2])(pMVar1,os);
    std::operator<<(os,"\n           Actual: ");
    testing_internal::DefaultPrintNonContainerTo<cv::Mat>(local_b8,os);
    std::__cxx11::stringbuf::str();
    PrintIfNotEmpty(&local_58,os);
    std::__cxx11::string::~string((string *)&local_58);
    std::operator<<(os,"\n");
  }
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_2b0);
  cv::Mat::~Mat(local_b8);
  MatcherBase<cv::Mat>::~MatcherBase((MatcherBase<cv::Mat> *)local_38);
  return;
}

Assistant:

static void ExplainMatchFailuresTo(const MatcherTuple& matchers,
                                     const ValueTuple& values,
                                     ::std::ostream* os) {
    // First, describes failures in the first N - 1 fields.
    TuplePrefix<N - 1>::ExplainMatchFailuresTo(matchers, values, os);

    // Then describes the failure (if any) in the (N - 1)-th (0-based)
    // field.
    typename tuple_element<N - 1, MatcherTuple>::type matcher =
        get<N - 1>(matchers);
    typedef typename tuple_element<N - 1, ValueTuple>::type Value;
    Value value = get<N - 1>(values);
    StringMatchResultListener listener;
    if (!matcher.MatchAndExplain(value, &listener)) {
      // TODO(wan): include in the message the name of the parameter
      // as used in MOCK_METHOD*() when possible.
      *os << "  Expected arg #" << N - 1 << ": ";
      get<N - 1>(matchers).DescribeTo(os);
      *os << "\n           Actual: ";
      // We remove the reference in type Value to prevent the
      // universal printer from printing the address of value, which
      // isn't interesting to the user most of the time.  The
      // matcher's MatchAndExplain() method handles the case when
      // the address is interesting.
      internal::UniversalPrint(value, os);
      PrintIfNotEmpty(listener.str(), os);
      *os << "\n";
    }
  }